

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O0

double __thiscall Console::log(Console *this,double __x)

{
  tm *__tmb;
  ostream *poVar1;
  size_type sVar2;
  string *in_RSI;
  double extraout_XMM0_Qa;
  __normal_iterator<Log_*,_std::vector<Log,_std::allocator<Log>_>_> local_238;
  const_iterator local_230;
  string local_228 [32];
  _Put_time<char> local_208;
  ostringstream local_1f8 [8];
  ostringstream stream;
  time_t local_80;
  time_t date_c;
  rep local_68;
  undefined1 local_60 [8];
  Log entry;
  string *message_local;
  Console *this_local;
  
  Log::Log((Log *)local_60);
  local_68 = std::chrono::_V2::system_clock::now();
  local_60 = (undefined1  [8])local_68;
  std::__cxx11::string::operator=((string *)(entry.formatted_date.field_2._M_local_buf + 8),in_RSI);
  local_80 = std::chrono::_V2::system_clock::to_time_t((time_point *)local_60);
  std::__cxx11::ostringstream::ostringstream(local_1f8);
  __tmb = localtime(&local_80);
  local_208 = std::put_time<char>((tm *)__tmb,"%H:%M:%S");
  std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)local_1f8,local_208);
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator=((string *)&entry,local_228);
  std::__cxx11::string::~string(local_228);
  poVar1 = std::operator<<((ostream *)&std::cout,"\x1b[1;34m[");
  poVar1 = std::operator<<(poVar1,(string *)&entry);
  poVar1 = std::operator<<(poVar1,"]\x1b[0m ");
  poVar1 = std::operator<<(poVar1,(string *)(entry.formatted_date.field_2._M_local_buf + 8));
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::vector<Log,_std::allocator<Log>_>::push_back(&this->history,(value_type *)local_60);
  sVar2 = std::vector<Log,_std::allocator<Log>_>::size(&this->history);
  if ((ulong)(long)this->history_size < sVar2) {
    local_238._M_current = (Log *)std::vector<Log,_std::allocator<Log>_>::begin(&this->history);
    __gnu_cxx::__normal_iterator<Log_const*,std::vector<Log,std::allocator<Log>>>::
    __normal_iterator<Log*>
              ((__normal_iterator<Log_const*,std::vector<Log,std::allocator<Log>>> *)&local_230,
               &local_238);
    std::vector<Log,_std::allocator<Log>_>::erase(&this->history,local_230);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1f8);
  Log::~Log((Log *)local_60);
  return extraout_XMM0_Qa;
}

Assistant:

void Console::log(std::string message) {
    Log entry;
    entry.date = std::chrono::system_clock::now();
    entry.message = message;
    
    std::time_t date_c = std::chrono::system_clock::to_time_t(entry.date);
    
    std::ostringstream stream;
    stream << std::put_time(std::localtime(&date_c), "%H:%M:%S");
    
    entry.formatted_date = stream.str();

    std::cout << "\033[1;34m[" << entry.formatted_date << "]\033[0m " << entry.message << std::endl;
    
    history.push_back(entry);
    
    if (history.size() > history_size) {
        history.erase(history.begin());
    }
}